

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

Character * __thiscall World::GetCharacterReal(World *this,string *real_name)

{
  pointer ppCVar1;
  Character *pCVar2;
  __type _Var3;
  pointer ppCVar4;
  string local_40;
  
  util::lowercase(&local_40,real_name);
  std::__cxx11::string::operator=((string *)real_name,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  ppCVar4 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppCVar1 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  do {
    if (ppCVar4 == ppCVar1) {
      return (Character *)0x0;
    }
    pCVar2 = *ppCVar4;
    _Var3 = std::operator==(&pCVar2->real_name,real_name);
    ppCVar4 = ppCVar4 + 1;
  } while (!_Var3);
  return pCVar2;
}

Assistant:

Character *World::GetCharacterReal(std::string real_name)
{
	real_name = util::lowercase(real_name);

	UTIL_FOREACH(this->characters, character)
	{
		if (character->real_name == real_name)
		{
			return character;
		}
	}

	return 0;
}